

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

Expression * __thiscall wasm::TranslateToFuzzReader::makePointer(TranslateToFuzzReader *this)

{
  bool bVar1;
  reference pvVar2;
  pointer pMVar3;
  address64_t aVar4;
  Const *pCVar5;
  Binary *local_18;
  Expression *ret;
  TranslateToFuzzReader *this_local;
  
  pvVar2 = std::
           vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                         *)(this->wasm + 0x78),0);
  pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar2);
  local_18 = (Binary *)make(this,(Type)(pMVar3->indexType).id);
  if (((this->allowOOB & 1U) == 0) || (bVar1 = oneIn(this,10), !bVar1)) {
    pvVar2 = std::
             vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ::operator[]((vector<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                           *)(this->wasm + 0x78),0);
    pMVar3 = std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>::operator->(pvVar2);
    bVar1 = Memory::is64(pMVar3);
    if (bVar1) {
      aVar4 = Address::operator_cast_to_unsigned_long((Address *)&USABLE_MEMORY);
      pCVar5 = Builder::makeConst<long>(&this->builder,aVar4 - 1);
      local_18 = Builder::makeBinary(&this->builder,AndInt64,(Expression *)local_18,
                                     (Expression *)pCVar5);
    }
    else {
      aVar4 = Address::operator_cast_to_unsigned_long((Address *)&USABLE_MEMORY);
      pCVar5 = Builder::makeConst<int>(&this->builder,(int)aVar4 + -1);
      local_18 = Builder::makeBinary(&this->builder,AndInt32,(Expression *)local_18,
                                     (Expression *)pCVar5);
    }
  }
  return (Expression *)local_18;
}

Assistant:

Expression* TranslateToFuzzReader::makePointer() {
  auto* ret = make(wasm.memories[0]->indexType);
  // with high probability, mask the pointer so it's in a reasonable
  // range. otherwise, most pointers are going to be out of range and
  // most memory ops will just trap
  if (!allowOOB || !oneIn(10)) {
    if (wasm.memories[0]->is64()) {
      ret = builder.makeBinary(
        AndInt64, ret, builder.makeConst(int64_t(USABLE_MEMORY - 1)));
    } else {
      ret = builder.makeBinary(
        AndInt32, ret, builder.makeConst(int32_t(USABLE_MEMORY - 1)));
    }
  }
  return ret;
}